

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo_p.h
# Opt level: O0

void __thiscall
QFileInfoPrivate::QFileInfoPrivate
          (QFileInfoPrivate *this,QFileSystemEntry *file,QFileSystemMetaData *data)

{
  bool bVar1;
  long lVar2;
  QFileSystemMetaData *this_00;
  void *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff58;
  QFileSystemEntry *in_stack_ffffffffffffff60;
  long local_98;
  QFileSystemMetaData *in_stack_ffffffffffffff70;
  QFileSystemEntry *in_stack_ffffffffffffff78;
  long local_80;
  long local_60;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData((QSharedData *)0x1286ca);
  QFileSystemEntry::QFileSystemEntry(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  memcpy((void *)(in_RDI + 0x40),in_RDX,0x38);
  QFileSystemEngine::createLegacyEngine(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_60 = in_RDI + 0x80;
  do {
    QString::QString((QString *)0x12873f);
    local_60 = local_60 + 0x18;
  } while (local_60 != in_RDI + 0x188);
  local_80 = in_RDI + 0x188;
  lVar2 = in_RDI + 0x1b8;
  do {
    QString::QString((QString *)0x128782);
    local_80 = local_80 + 0x18;
  } while (local_80 != lVar2);
  local_98 = in_RDI + 0x1b8;
  this_00 = (QFileSystemMetaData *)(in_RDI + 0x1d8);
  do {
    QDateTime::QDateTime((QDateTime *)0x1287c4);
    local_98 = local_98 + 8;
  } while ((QFileSystemMetaData *)local_98 != this_00);
  *(uint *)(in_RDI + 0x1d8) = *(uint *)(in_RDI + 0x1d8) & 0xc0000000;
  *(uint *)(in_RDI + 0x1d8) = *(uint *)(in_RDI + 0x1d8) & 0xbfffffff;
  *(uint *)(in_RDI + 0x1d8) = *(uint *)(in_RDI + 0x1d8) & 0x7fffffff | 0x80000000;
  *(undefined4 *)(in_RDI + 0x1dc) = 0;
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x12883c);
  if (bVar1) {
    QFileSystemMetaData::QFileSystemMetaData(this_00);
    memcpy((void *)(in_RDI + 0x40),local_40,0x38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline QFileInfoPrivate(const QFileSystemEntry &file, const QFileSystemMetaData &data)
        : QSharedData(),
        fileEntry(file),
        metaData(data),
        fileEngine(QFileSystemEngine::createLegacyEngine(fileEntry, metaData)),
        cachedFlags(0),
        isDefaultConstructed(false),
        cache_enabled(true), fileFlags(0), fileSize(0)
    {
        //If the file engine is not null, this maybe a "mount point" for a custom file engine
        //in which case we can't trust the metadata
        if (fileEngine)
            metaData = QFileSystemMetaData();
    }